

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O0

BOOL Js::JavascriptConversion::CanonicalNumericIndexString
               (JavascriptString *aValue,double *indexValue,ScriptContext *scriptContext)

{
  bool bVar1;
  JavascriptString *aLeft;
  double value;
  double indexDoubleValue;
  ScriptContext *scriptContext_local;
  double *indexValue_local;
  JavascriptString *aValue_local;
  
  bVar1 = JavascriptString::IsNegZero(aValue);
  if (bVar1) {
    *indexValue = 0.0;
    aValue_local._4_4_ = 1;
  }
  else {
    value = JavascriptString::ToDouble(aValue);
    aLeft = JavascriptNumber::ToStringRadix10(value,scriptContext);
    bVar1 = JavascriptString::Equals(aLeft,aValue);
    if (bVar1) {
      *indexValue = value;
      aValue_local._4_4_ = 1;
    }
    else {
      aValue_local._4_4_ = 0;
    }
  }
  return aValue_local._4_4_;
}

Assistant:

BOOL JavascriptConversion::CanonicalNumericIndexString(JavascriptString *aValue, double *indexValue, ScriptContext * scriptContext)
    {
        if (JavascriptString::IsNegZero(aValue))
        {
            *indexValue = -0;
            return TRUE;
        }

        double indexDoubleValue = aValue->ToDouble();
        if (JavascriptString::Equals(JavascriptNumber::ToStringRadix10(indexDoubleValue, scriptContext), aValue))
        {
            *indexValue = indexDoubleValue;
            return TRUE;
        }

        return FALSE;
    }